

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O3

void __thiscall
Assimp::AMFImporter::XML_CheckNode_SkipUnsupported(AMFImporter *this,string *pParentNodeName)

{
  int iVar1;
  undefined4 extraout_var;
  Logger *this_00;
  runtime_error *this_01;
  long *plVar2;
  long *plVar3;
  ProgressHandler **ppPVar4;
  bool bVar5;
  AMFImporter *this_02;
  long lVar6;
  bool bVar7;
  string nn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  ProgressHandler *local_198;
  CAMFImporter_NodeElement *pCStack_190;
  ios_base local_138 [264];
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_208,(char *)CONCAT44(extraout_var,iVar1),
             (allocator<char> *)local_1a8._M_local_buf);
  bVar5 = false;
  lVar6 = 0;
  do {
    while (this_02 = (AMFImporter *)local_208,
          iVar1 = std::__cxx11::string::compare((char *)local_208), iVar1 != 0) {
      lVar6 = lVar6 + 1;
      if (lVar6 == 3) {
        if (!bVar5) goto LAB_003dbffc;
        goto LAB_003dbff2;
      }
    }
    iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
    if ((char)iVar1 != '\0') {
LAB_003dbecf:
      if (XML_CheckNode_SkipUnsupported::skipped_before[lVar6] == false) {
        XML_CheckNode_SkipUnsupported::skipped_before[lVar6] = true;
        this_00 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[16]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_1a8,(char (*) [16])"Skipping node \"");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8._M_local_buf,(char *)local_208._0_8_,local_208._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8._M_local_buf,"\" in ",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8._M_local_buf,(pParentNodeName->_M_dataplus)._M_p,
                   pParentNodeName->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8._M_local_buf,".",1);
        std::__cxx11::stringbuf::str();
        Logger::warn(this_00,local_228._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_local_buf);
        std::ios_base::~ios_base(local_138);
      }
      if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
        operator_delete((void *)local_208._0_8_,local_1f8._M_allocated_capacity + 1);
      }
      return;
    }
    while( true ) {
      this_02 = (AMFImporter *)this->mReader;
      iVar1 = (*(this_02->super_BaseImporter)._vptr_BaseImporter[2])();
      if ((char)iVar1 == '\0') break;
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar1 == 2) {
        (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = std::__cxx11::string::compare((char *)local_208);
        if (iVar1 == 0) goto LAB_003dbecf;
      }
    }
    bVar5 = true;
    bVar7 = lVar6 != 2;
    lVar6 = lVar6 + 1;
  } while (bVar7);
LAB_003dbff2:
  Throw_CloseNotFound(this_02,(string *)local_208);
LAB_003dbffc:
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_1e8,"Unknown node \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  local_1c8._M_dataplus._M_p = (pointer)*plVar2;
  plVar3 = plVar2 + 2;
  if ((long *)local_1c8._M_dataplus._M_p == plVar3) {
    local_1c8.field_2._M_allocated_capacity = *plVar3;
    local_1c8.field_2._8_8_ = plVar2[3];
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  }
  else {
    local_1c8.field_2._M_allocated_capacity = *plVar3;
  }
  local_1c8._M_string_length = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::operator+(&local_228,&local_1c8,pParentNodeName);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_228);
  local_1a8._M_allocated_capacity = *plVar2;
  ppPVar4 = (ProgressHandler **)(plVar2 + 2);
  if ((ProgressHandler **)local_1a8._M_allocated_capacity == ppPVar4) {
    local_198 = *ppPVar4;
    pCStack_190 = (CAMFImporter_NodeElement *)plVar2[3];
    local_1a8._M_allocated_capacity = (size_type)&local_198;
  }
  else {
    local_198 = *ppPVar4;
  }
  local_1a8._8_8_ = plVar2[1];
  *plVar2 = (long)ppPVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_01,(string *)local_1a8._M_local_buf);
  *(undefined ***)this_01 = &PTR__runtime_error_0080bf48;
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AMFImporter::XML_CheckNode_SkipUnsupported(const std::string& pParentNodeName)
{
    static const size_t Uns_Skip_Len = 3;
    const char* Uns_Skip[Uns_Skip_Len] = { "composite", "edge", "normal" };

    static bool skipped_before[Uns_Skip_Len] = { false, false, false };

    std::string nn(mReader->getNodeName());
    bool found = false;
    bool close_found = false;
    size_t sk_idx;

	for(sk_idx = 0; sk_idx < Uns_Skip_Len; sk_idx++)
	{
		if(nn != Uns_Skip[sk_idx]) continue;

		found = true;
		if(mReader->isEmptyElement())
		{
			close_found = true;

			goto casu_cres;
		}

		while(mReader->read())
		{
			if((mReader->getNodeType() == irr::io::EXN_ELEMENT_END) && (nn == mReader->getNodeName()))
			{
				close_found = true;

				goto casu_cres;
			}
		}
	}// for(sk_idx = 0; sk_idx < Uns_Skip_Len; sk_idx++)

casu_cres:

	if(!found) throw DeadlyImportError("Unknown node \"" + nn + "\" in " + pParentNodeName + ".");
	if(!close_found) Throw_CloseNotFound(nn);

	if(!skipped_before[sk_idx])
	{
		skipped_before[sk_idx] = true;
        ASSIMP_LOG_WARN_F("Skipping node \"", nn, "\" in ", pParentNodeName, ".");
	}
}